

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O1

void __thiscall
google::protobuf::internal::ExtensionSet::UnsafeArenaSetAllocatedMessage
          (ExtensionSet *this,int number,FieldType type,FieldDescriptor *descriptor,
          MessageLite *message)

{
  Extension *pEVar1;
  Nonnull<const_char_*> pcVar2;
  undefined1 *v1;
  ExtensionSet *const_this;
  pair<google::protobuf::internal::ExtensionSet::Extension_*,_bool> pVar3;
  undefined1 auStack_38 [16];
  
  v1 = auStack_38;
  if (message == (MessageLite *)0x0) {
    pEVar1 = FindOrNull(this,number);
    if (pEVar1 == (Extension *)0x0) {
      return;
    }
    Extension::Clear(pEVar1);
    return;
  }
  pVar3 = Insert(this,number);
  pEVar1 = pVar3.first;
  pEVar1->descriptor = descriptor;
  if (((undefined1  [16])pVar3 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    if (pEVar1->is_repeated != false) goto LAB_0023f730;
    pcVar2 = (Nonnull<const_char_*>)0x0;
LAB_0023f6ad:
    if (pcVar2 != (Nonnull<const_char_*>)0x0) {
      UnsafeArenaSetAllocatedMessage();
      goto LAB_0023f787;
    }
    if ((byte)(pEVar1->type - 0x13) < 0xee) {
      UnsafeArenaSetAllocatedMessage((ExtensionSet *)auStack_38);
      goto LAB_0023f750;
    }
    if ((ulong)*(uint *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)pEVar1->type * 4) == 10) {
      pcVar2 = (Nonnull<const_char_*>)0x0;
    }
    else {
      pcVar2 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                         ((ulong)*(uint *)(WireFormatLite::kFieldTypeToCppTypeMap +
                                          (ulong)pEVar1->type * 4),10,
                          "cpp_type((*extension).type) == WireFormatLite::CPPTYPE_MESSAGE");
    }
    if (pcVar2 != (Nonnull<const_char_*>)0x0) goto LAB_0023f792;
    if ((pEVar1->field_0xa & 4) != 0) {
      (**(code **)(**(long **)&(pEVar1->field_0).int32_t_value + 0x38))
                (*(long **)&(pEVar1->field_0).int32_t_value,message,this->arena_);
      goto LAB_0023f715;
    }
    if ((this->arena_ == (Arena *)0x0) && ((long *)(pEVar1->field_0).int64_t_value != (long *)0x0))
    {
      (**(code **)(*(long *)(pEVar1->field_0).int64_t_value + 8))();
    }
  }
  else {
    pEVar1->type = type;
    if ((byte)(type - 0x13) < 0xee) {
      UnsafeArenaSetAllocatedMessage((ExtensionSet *)auStack_38);
LAB_0023f730:
      pcVar2 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                         (0,1,
                          "(*extension).is_repeated ? REPEATED_FIELD : OPTIONAL_FIELD == OPTIONAL_FIELD"
                         );
      goto LAB_0023f6ad;
    }
    v1 = (undefined1 *)(ulong)*(uint *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)type * 4);
    if (v1 == (undefined1 *)0xa) {
      pcVar2 = (Nonnull<const_char_*>)0x0;
    }
    else {
LAB_0023f750:
      pcVar2 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                         ((long)v1,10,"cpp_type(extension->type) == WireFormatLite::CPPTYPE_MESSAGE"
                         );
    }
    if (pcVar2 != (Nonnull<const_char_*>)0x0) {
LAB_0023f787:
      UnsafeArenaSetAllocatedMessage();
LAB_0023f792:
      UnsafeArenaSetAllocatedMessage();
    }
    pEVar1->is_repeated = false;
    pEVar1->field_0xa = (pEVar1->field_0xa & 0xfa) + 1;
  }
  pEVar1->field_0 = (anon_union_8_9_fdc4a54a_for_Extension_0)message;
LAB_0023f715:
  pEVar1->field_0xa = pEVar1->field_0xa & 0xfd;
  return;
}

Assistant:

void ExtensionSet::UnsafeArenaSetAllocatedMessage(
    int number, FieldType type, const FieldDescriptor* descriptor,
    MessageLite* message) {
  if (message == nullptr) {
    ClearExtension(number);
    return;
  }
  Extension* extension;
  if (MaybeNewExtension(number, descriptor, &extension)) {
    extension->type = type;
    ABSL_DCHECK_EQ(cpp_type(extension->type), WireFormatLite::CPPTYPE_MESSAGE);
    extension->is_repeated = false;
    extension->is_pointer = true;
    extension->is_lazy = false;
    extension->ptr.message_value = message;
  } else {
    ABSL_DCHECK_TYPE(*extension, OPTIONAL_FIELD, MESSAGE);
    if (extension->is_lazy) {
      extension->ptr.lazymessage_value->UnsafeArenaSetAllocatedMessage(message,
                                                                       arena_);
    } else {
      if (arena_ == nullptr) {
        delete extension->ptr.message_value;
      }
      extension->ptr.message_value = message;
    }
  }
  extension->is_cleared = false;
}